

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
::val(FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
      *this)

{
  value_type vVar1;
  value_type vVar2;
  
  vVar1 = FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_>::val
                    ((FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)0x1722a4a);
  vVar2 = FadExpr<FadFuncSin<Fad<double>_>_>::val((FadExpr<FadFuncSin<Fad<double>_>_> *)0x1722a5d);
  return vVar1 * vVar2;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}